

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.cpp
# Opt level: O2

int __thiscall ncnn::Embed::load_model(Embed *this,ModelBin *mb)

{
  int iVar1;
  Mat MStack_68;
  
  (*mb->_vptr_ModelBin[2])(&MStack_68,mb,(ulong)(uint)this->weight_data_size,0);
  Mat::operator=(&this->weight_data,&MStack_68);
  Mat::~Mat(&MStack_68);
  iVar1 = -100;
  if (((this->weight_data).data != (void *)0x0) &&
     ((long)(this->weight_data).c * (this->weight_data).cstep != 0)) {
    if (this->bias_term != 0) {
      (*mb->_vptr_ModelBin[2])(&MStack_68,mb,(ulong)(uint)this->num_output,1);
      Mat::operator=(&this->bias_data,&MStack_68);
      Mat::~Mat(&MStack_68);
      if ((this->bias_data).data == (void *)0x0) {
        return -100;
      }
      if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
        return -100;
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int Embed::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}